

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tictoc.h
# Opt level: O2

Time bsplib::TicToc::timeDiff(Time a,Time b)

{
  Time TVar1;
  Time TVar2;
  Time TVar3;
  
  TVar2.tv_sec = a.tv_sec - b.tv_sec;
  TVar2.tv_nsec = a.tv_nsec - b.tv_nsec;
  if (999999999 < TVar2.tv_nsec) {
    TVar1.tv_sec = TVar2.tv_sec + 1;
    TVar1.tv_nsec = TVar2.tv_nsec + -1000000000;
    return TVar1;
  }
  if (-1 < TVar2.tv_nsec) {
    return TVar2;
  }
  TVar3.tv_sec = TVar2.tv_sec + -1;
  TVar3.tv_nsec = TVar2.tv_nsec + 1000000000;
  return TVar3;
}

Assistant:

static Time timeDiff( Time a, Time b )
    { a.tv_sec -= b.tv_sec; 
      a.tv_nsec -= b.tv_nsec;
      if ( a.tv_nsec >= 1000000000l ) {
          a.tv_sec += 1;
          a.tv_nsec -= 1000000000l;
      } else if ( a.tv_nsec < 0) {
          a.tv_sec -= 1;
          a.tv_nsec += 1000000000l;
      }
      return a;
    }